

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O0

bool parseIp6(QString *address,IPv6Address *addr,QString *scopeId)

{
  QStringView *this;
  qsizetype qVar1;
  const_iterator pvVar2;
  const_iterator pvVar3;
  long lVar4;
  qsizetype in_RDX;
  QStringView *in_RSI;
  long in_FS_OFFSET;
  qsizetype scopeIdPos;
  QStringView tmp;
  QString *in_stack_ffffffffffffff78;
  QStringView *in_stack_ffffffffffffff80;
  QString *in_stack_ffffffffffffff88;
  QChar c;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  QChar local_1a;
  QStringView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18.m_size = -0x5555555555555556;
  local_18.m_data = (storage_type_conflict *)0xaaaaaaaaaaaaaaaa;
  QStringView::QStringView<QString,_true>
            ((QStringView *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
             in_stack_ffffffffffffff88);
  c.ucs = (char16_t)((ulong)in_stack_ffffffffffffff88 >> 0x30);
  QChar::QChar<char16_t,_true>(&local_1a,L'%');
  this = (QStringView *)
         QStringView::lastIndexOf
                   (in_stack_ffffffffffffff80,c,
                    (CaseSensitivity)((ulong)in_stack_ffffffffffffff78 >> 0x20));
  if (this == (QStringView *)0xffffffffffffffff) {
    QString::clear((QString *)in_stack_ffffffffffffff80);
  }
  else {
    QStringView::mid(this,(qsizetype)in_RSI,in_RDX);
    QStringView::toString(in_stack_ffffffffffffff80);
    QString::operator=((QString *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    QString::~QString((QString *)0x21621a);
    qVar1 = QStringView::size(&local_18);
    QStringView::chop(&local_18,qVar1 - (long)this);
  }
  pvVar2 = QStringView::begin((QStringView *)0x21625a);
  pvVar3 = QStringView::end(in_RSI);
  lVar4 = QIPAddressUtils::parseIp6((unsigned_char *)in_RSI,pvVar2,pvVar3);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return lVar4 == 0;
  }
  __stack_chk_fail();
}

Assistant:

static bool parseIp6(const QString &address, QIPAddressUtils::IPv6Address &addr, QString *scopeId)
{
    QStringView tmp(address);
    qsizetype scopeIdPos = tmp.lastIndexOf(u'%');
    if (scopeIdPos != -1) {
        *scopeId = tmp.mid(scopeIdPos + 1).toString();
        tmp.chop(tmp.size() - scopeIdPos);
    } else {
        scopeId->clear();
    }
    return QIPAddressUtils::parseIp6(addr, tmp.begin(), tmp.end()) == nullptr;
}